

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O0

int xmlFAEqualAtoms(xmlRegAtomPtr atom1,xmlRegAtomPtr atom2,int deep)

{
  uint local_28;
  int ret;
  int deep_local;
  xmlRegAtomPtr atom2_local;
  xmlRegAtomPtr atom1_local;
  
  if (atom1 == atom2) {
    atom1_local._4_4_ = 1;
  }
  else if ((atom1 == (xmlRegAtomPtr)0x0) || (atom2 == (xmlRegAtomPtr)0x0)) {
    atom1_local._4_4_ = 0;
  }
  else if (atom1->type == atom2->type) {
    switch(atom1->type) {
    case XML_REGEXP_EPSILON:
      local_28 = 0;
      break;
    case XML_REGEXP_CHARVAL:
      local_28 = (uint)(atom1->codepoint == atom2->codepoint);
      break;
    case XML_REGEXP_RANGES:
    default:
      local_28 = 0;
      break;
    case XML_REGEXP_STRING:
      if (deep == 0) {
        local_28 = (uint)(atom1->valuep == atom2->valuep);
      }
      else {
        local_28 = xmlStrEqual((xmlChar *)atom1->valuep,(xmlChar *)atom2->valuep);
      }
    }
    atom1_local._4_4_ = local_28;
  }
  else {
    atom1_local._4_4_ = 0;
  }
  return atom1_local._4_4_;
}

Assistant:

static int
xmlFAEqualAtoms(xmlRegAtomPtr atom1, xmlRegAtomPtr atom2, int deep) {
    int ret = 0;

    if (atom1 == atom2)
	return(1);
    if ((atom1 == NULL) || (atom2 == NULL))
	return(0);

    if (atom1->type != atom2->type)
        return(0);
    switch (atom1->type) {
        case XML_REGEXP_EPSILON:
	    ret = 0;
	    break;
        case XML_REGEXP_STRING:
            if (!deep)
                ret = (atom1->valuep == atom2->valuep);
            else
                ret = xmlStrEqual((xmlChar *)atom1->valuep,
                                  (xmlChar *)atom2->valuep);
	    break;
        case XML_REGEXP_CHARVAL:
	    ret = (atom1->codepoint == atom2->codepoint);
	    break;
	case XML_REGEXP_RANGES:
	    /* too hard to do in the general case */
	    ret = 0;
	default:
	    break;
    }
    return(ret);
}